

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int saveCursorsOnList(BtCursor *p,Pgno iRoot,BtCursor *pExcept)

{
  int iVar1;
  
  do {
    if ((p != pExcept) && ((iRoot == 0 || (p->pgnoRoot == iRoot)))) {
      if ((byte)(p->eState - 1) < 2) {
        iVar1 = saveCursorPosition(p);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      else {
        btreeReleaseAllCursorPages(p);
      }
    }
    p = p->pNext;
  } while (p != (BtCursor *)0x0);
  return 0;
}

Assistant:

static int SQLITE_NOINLINE saveCursorsOnList(
  BtCursor *p,         /* The first cursor that needs saving */
  Pgno iRoot,          /* Only save cursor with this iRoot. Save all if zero */
  BtCursor *pExcept    /* Do not save this cursor */
){
  do{
    if( p!=pExcept && (0==iRoot || p->pgnoRoot==iRoot) ){
      if( p->eState==CURSOR_VALID || p->eState==CURSOR_SKIPNEXT ){
        int rc = saveCursorPosition(p);
        if( SQLITE_OK!=rc ){
          return rc;
        }
      }else{
        testcase( p->iPage>0 );
        btreeReleaseAllCursorPages(p);
      }
    }
    p = p->pNext;
  }while( p );
  return SQLITE_OK;
}